

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySubImage3D::configureDataBuffer
          (TextureCubeMapArraySubImage3D *this,GLuint width,GLuint height,GLuint depth,
          SubImage3DCopyParams *copy_params,GLuint clear_value)

{
  pointer puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  GLuint component_1;
  long lVar10;
  GLuint component;
  int iVar11;
  GLuint local_34;
  
  local_34 = clear_value;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->m_copy_data_buffer,
             (ulong)(copy_params->m_width * copy_params->m_height * copy_params->m_depth * 4),
             &local_34);
  uVar2 = copy_params->m_zoffset;
  if (uVar2 < copy_params->m_depth + uVar2) {
    iVar3 = uVar2 * height;
    iVar11 = 0;
    do {
      uVar4 = copy_params->m_yoffset;
      if (uVar4 < copy_params->m_height + uVar4) {
        puVar1 = (this->m_copy_data_buffer).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar6 = (uVar4 + iVar3) * width * 4;
        do {
          uVar8 = copy_params->m_xoffset;
          if (uVar8 < copy_params->m_width + uVar8) {
            iVar9 = iVar6 + uVar8 * 4;
            do {
              iVar5 = iVar11;
              iVar11 = 0;
              do {
                puVar1[(uint)(iVar5 + iVar11)] = iVar9 + iVar11;
                iVar11 = iVar11 + 1;
              } while (iVar11 != 4);
              uVar8 = uVar8 + 1;
              iVar9 = iVar9 + 4;
              iVar11 = iVar5 + 4;
            } while (uVar8 < copy_params->m_width + copy_params->m_xoffset);
            iVar11 = iVar5 + 4;
          }
          uVar4 = uVar4 + 1;
          iVar6 = iVar6 + width * 4;
        } while (uVar4 < copy_params->m_height + copy_params->m_yoffset);
      }
      uVar2 = uVar2 + 1;
      iVar3 = iVar3 + height;
    } while (uVar2 < copy_params->m_depth + copy_params->m_zoffset);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->m_expected_data_buffer,(ulong)(height * width * depth * 4),&local_34);
  uVar2 = copy_params->m_zoffset;
  if (uVar2 < copy_params->m_depth + uVar2) {
    iVar11 = uVar2 * height;
    do {
      uVar4 = copy_params->m_yoffset;
      if (uVar4 < copy_params->m_height + uVar4) {
        puVar1 = (this->m_expected_data_buffer).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = (uVar4 + iVar11) * width;
        do {
          uVar8 = copy_params->m_xoffset;
          uVar7 = (ulong)uVar8;
          if (uVar8 < copy_params->m_width + uVar8) {
            uVar8 = (uVar8 + iVar3) * 4;
            do {
              lVar10 = 0;
              do {
                puVar1[(ulong)uVar8 + lVar10] =
                     ((uVar4 + uVar2 * height) * width + (int)uVar7) * 4 | (uint)lVar10;
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              uVar7 = uVar7 + 1;
              uVar8 = uVar8 + 4;
            } while (uVar7 < copy_params->m_width + copy_params->m_xoffset);
          }
          uVar4 = uVar4 + 1;
          iVar3 = iVar3 + width;
        } while (uVar4 < copy_params->m_height + copy_params->m_yoffset);
      }
      uVar2 = uVar2 + 1;
      iVar11 = iVar11 + height;
    } while (uVar2 < copy_params->m_depth + copy_params->m_zoffset);
  }
  return;
}

Assistant:

void TextureCubeMapArraySubImage3D::configureDataBuffer(glw::GLuint width, glw::GLuint height, glw::GLuint depth,
														const SubImage3DCopyParams& copy_params,
														glw::GLuint					clear_value)
{
	glw::GLuint index = 0;

	m_copy_data_buffer.assign(copy_params.m_width * copy_params.m_height * copy_params.m_depth * m_n_components,
							  clear_value);
	for (glw::GLuint zoffset = copy_params.m_zoffset; zoffset < copy_params.m_zoffset + copy_params.m_depth; ++zoffset)
	{
		for (glw::GLuint yoffset = copy_params.m_yoffset; yoffset < copy_params.m_yoffset + copy_params.m_height;
			 ++yoffset)
		{
			for (glw::GLuint xoffset = copy_params.m_xoffset; xoffset < copy_params.m_xoffset + copy_params.m_width;
				 ++xoffset)
			{
				for (glw::GLuint component = 0; component < m_n_components; ++component)
				{
					m_copy_data_buffer[index++] =
						(zoffset * width * height + yoffset * width + xoffset) * m_n_components + component;
				}
			}
		}
	}

	m_expected_data_buffer.assign(width * height * depth * m_n_components, clear_value);
	for (glw::GLuint zoffset = copy_params.m_zoffset; zoffset < copy_params.m_zoffset + copy_params.m_depth; ++zoffset)
	{
		for (glw::GLuint yoffset = copy_params.m_yoffset; yoffset < copy_params.m_yoffset + copy_params.m_height;
			 ++yoffset)
		{
			for (glw::GLuint xoffset = copy_params.m_xoffset; xoffset < copy_params.m_xoffset + copy_params.m_width;
				 ++xoffset)
			{
				glw::GLuint* data_pointer =
					&m_expected_data_buffer[(zoffset * width * height + yoffset * width + xoffset) * m_n_components];
				for (glw::GLuint component = 0; component < m_n_components; ++component)
				{
					data_pointer[component] =
						(zoffset * width * height + yoffset * width + xoffset) * m_n_components + component;
				}
			}
		}
	}
}